

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

namespace_t * __thiscall cs_impl::any::holder<cs::structure>::get_ext(holder<cs::structure> *this)

{
  namespace_t *pnVar1;
  
  pnVar1 = get_ext<cs::structure>();
  return pnVar1;
}

Assistant:

virtual cs::namespace_t &get_ext() const override
			{
				return cs_impl::get_ext<T>();
			}